

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall
myEmployeeBoss::myEmployeeBoss(myEmployeeBoss *this,int m_age,double m_wages,bool m_is_dumb)

{
  allocator local_61;
  double local_60;
  string local_58;
  string local_38;
  
  local_60 = m_wages;
  std::__cxx11::string::string((string *)&local_38,"John",&local_61);
  myEmployee::myEmployee(&this->super_myEmployee,m_age,local_60,ATHLETIC,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployeeBoss_00160350;
  this->is_dumb = m_is_dumb;
  std::__cxx11::string::string((string *)&local_58,"John",&local_61);
  myEmployee::myEmployee(&this->slave,0x15,300.0,ATHLETIC,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

myEmployeeBoss(int m_age = 38, double m_wages = 9000.4, bool m_is_dumb = true)
        : myEmployee(m_age, m_wages), 
        is_dumb(m_is_dumb),
        slave(21, 300){}